

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FinishTrigger(Parse *pParse,TriggerStep *pStepList,Token *pAll)

{
  TriggerStep **ppTVar1;
  sqlite3 *db_00;
  Schema *pSVar2;
  char *__s;
  int iVar3;
  TriggerStep *pTVar4;
  size_t sVar5;
  Vdbe *p;
  ulong __n;
  void *pvVar6;
  char *pcVar7;
  Trigger *pTrigger;
  HashElem *pHVar8;
  Schema **ppSVar9;
  sqlite3 *db;
  Upsert *pUVar10;
  int iDb;
  Trigger *data;
  Token nameToken;
  DbFixer sFix;
  char *local_128;
  uint local_120;
  Select local_118;
  Parse *local_90;
  Walker local_88;
  Schema *local_58;
  undefined1 local_50;
  char *local_48;
  char *local_40;
  char **local_38;
  
  db_00 = pParse->db;
  pTrigger = pParse->pNewTrigger;
  pParse->pNewTrigger = (Trigger *)0x0;
  if (pTrigger == (Trigger *)0x0 || pParse->nErr != 0) goto LAB_00182b4b;
  if (pTrigger->pSchema == (Schema *)0x0) {
    iDb = -0x8000;
  }
  else {
    iDb = -1;
    ppSVar9 = &db_00->aDb->pSchema;
    do {
      iDb = iDb + 1;
      pSVar2 = *ppSVar9;
      ppSVar9 = ppSVar9 + 4;
    } while (pSVar2 != pTrigger->pSchema);
  }
  __s = pTrigger->zName;
  pTrigger->step_list = pStepList;
  pTVar4 = pStepList;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      pTVar4->pTrig = pTrigger;
      ppTVar1 = &pTVar4->pNext;
      pTVar4 = *ppTVar1;
    } while (*ppTVar1 != (TriggerStep *)0x0);
  }
  local_128 = __s;
  if (__s == (char *)0x0) {
    local_120 = 0;
  }
  else {
    sVar5 = strlen(__s);
    local_120 = (uint)sVar5 & 0x3fffffff;
  }
  local_38 = &local_128;
  local_48 = db_00->aDb[iDb].zDbSName;
  local_58 = db_00->aDb[iDb].pSchema;
  local_50 = iDb == 1;
  local_40 = "trigger";
  local_88.xExprCallback = fixExprCb;
  local_88.xSelectCallback = fixSelectCb;
  local_88.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
  local_88.walkerDepth = 0;
  local_88.eCode = 0;
  local_88.u.pNC = (NameContext *)&local_90;
  local_90 = pParse;
  local_88.pParse = pParse;
  if (pStepList != (TriggerStep *)0x0) {
    do {
      iVar3 = sqlite3WalkSelect(&local_88,pStepList->pSelect);
      if ((iVar3 != 0) ||
         (((pStepList->pWhere != (Expr *)0x0 &&
           (iVar3 = walkExpr(&local_88,pStepList->pWhere), iVar3 != 0)) ||
          (iVar3 = sqlite3WalkExprList(&local_88,pStepList->pExprList), iVar3 != 0))))
      goto LAB_00182b48;
      if (pStepList->pFrom != (SrcList *)0x0) {
        local_118.pEList = (ExprList *)0x0;
        local_118.pWin = (Window *)0x0;
        local_118.pWinDefn = (Window *)0x0;
        local_118.pLimit = (Expr *)0x0;
        local_118.pWith = (With *)0x0;
        local_118.pPrior = (Select *)0x0;
        local_118.pNext = (Select *)0x0;
        local_118.pHaving = (Expr *)0x0;
        local_118.pOrderBy = (ExprList *)0x0;
        local_118.pWhere = (Expr *)0x0;
        local_118.pGroupBy = (ExprList *)0x0;
        local_118.selId = 0;
        local_118.addrOpenEphm[0] = 0;
        local_118.addrOpenEphm[1] = 0;
        local_118._28_4_ = 0;
        local_118.op = '\0';
        local_118._1_1_ = 0;
        local_118.nSelectRow = 0;
        local_118.selFlags = 0;
        local_118.iLimit = 0;
        local_118.iOffset = 0;
        local_118.pSrc = pStepList->pFrom;
        iVar3 = sqlite3WalkSelect(&local_88,&local_118);
        if (iVar3 != 0) goto LAB_00182b48;
      }
      for (pUVar10 = pStepList->pUpsert; pUVar10 != (Upsert *)0x0; pUVar10 = pUVar10->pNextUpsert) {
        iVar3 = sqlite3WalkExprList(&local_88,pUVar10->pUpsertTarget);
        if ((((iVar3 != 0) ||
             ((pUVar10->pUpsertTargetWhere != (Expr *)0x0 &&
              (iVar3 = walkExpr(&local_88,pUVar10->pUpsertTargetWhere), iVar3 != 0)))) ||
            (iVar3 = sqlite3WalkExprList(&local_88,pUVar10->pUpsertSet), iVar3 != 0)) ||
           ((pUVar10->pUpsertWhere != (Expr *)0x0 &&
            (iVar3 = walkExpr(&local_88,pUVar10->pUpsertWhere), iVar3 != 0)))) goto LAB_00182a5c;
      }
      pStepList = pStepList->pNext;
    } while (pStepList != (TriggerStep *)0x0);
  }
  if ((pTrigger->pWhen == (Expr *)0x0) || (iVar3 = walkExpr(&local_88,pTrigger->pWhen), iVar3 == 0))
  {
    if (pParse->eParseMode < 2) {
      data = pTrigger;
      if ((db_00->init).busy == '\0') {
        if (((((db_00->flags & 0x10000000) != 0) && (db_00->pVtabCtx == (VtabCtx *)0x0)) &&
            (db_00->nVdbeExec == 0)) && ((db_00->nVTrans < 1 || (db_00->aVTrans != (VTable **)0x0)))
           ) {
          for (pTVar4 = pTrigger->step_list; pTVar4 != (TriggerStep *)0x0; pTVar4 = pTVar4->pNext) {
            if ((pTVar4->zTarget != (char *)0x0) &&
               (iVar3 = sqlite3ShadowTableName(db_00,pTVar4->zTarget), iVar3 != 0)) {
              sqlite3ErrorMsg(pParse,"trigger \"%s\" may not write to shadow table \"%s\"",
                              pTrigger->zName,pTVar4->zTarget);
              goto LAB_00182a5c;
            }
          }
        }
        p = sqlite3GetVdbe(pParse);
        if (p == (Vdbe *)0x0) {
LAB_00182a5c:
          pStepList = (TriggerStep *)0x0;
          goto LAB_00182b4b;
        }
        pvVar6 = (void *)0x0;
        sqlite3BeginWriteOperation(pParse,0,iDb);
        pcVar7 = pAll->z;
        if (pcVar7 != (char *)0x0) {
          __n = (ulong)pAll->n;
          pvVar6 = sqlite3DbMallocRawNN(db_00,__n + 1);
          if (pvVar6 == (void *)0x0) {
            pvVar6 = (void *)0x0;
          }
          else {
            memcpy(pvVar6,pcVar7,__n);
            *(undefined1 *)((long)pvVar6 + __n) = 0;
          }
        }
        sqlite3NestedParse(pParse,
                           "INSERT INTO %Q.sqlite_master VALUES(\'trigger\',%Q,%Q,0,\'CREATE TRIGGER %q\')"
                           ,db_00->aDb[iDb].zDbSName,__s,pTrigger->table,pvVar6);
        if (pvVar6 != (void *)0x0) {
          sqlite3DbFreeNN(db_00,pvVar6);
        }
        sqlite3VdbeAddOp3(pParse->pVdbe,100,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1)
        ;
        pcVar7 = sqlite3MPrintf(db_00,"type=\'trigger\' AND name=\'%q\'",__s);
        sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar7,0);
      }
    }
    else {
      pParse->pNewTrigger = pTrigger;
      data = (Trigger *)0x0;
    }
    pTrigger = data;
    if ((db_00->init).busy != '\0') {
      pTrigger = (Trigger *)sqlite3HashInsert(&(db_00->aDb[iDb].pSchema)->trigHash,__s,data);
      if (pTrigger != (Trigger *)0x0) {
        sqlite3OomFault(db_00);
        pStepList = (TriggerStep *)0x0;
        goto LAB_00182b4b;
      }
      if (data->pSchema == data->pTabSchema) {
        pStepList = (TriggerStep *)0x0;
        pHVar8 = findElementWithHash(&data->pTabSchema->tblHash,data->table,(uint *)0x0);
        pvVar6 = pHVar8->data;
        data->pNext = *(Trigger **)((long)pvVar6 + 0x58);
        *(Trigger **)((long)pvVar6 + 0x58) = data;
        pTrigger = (Trigger *)0x0;
        goto LAB_00182b4b;
      }
      pTrigger = (Trigger *)0x0;
    }
  }
LAB_00182b48:
  pStepList = (TriggerStep *)0x0;
LAB_00182b4b:
  sqlite3DeleteTrigger(db_00,pTrigger);
  sqlite3DeleteTriggerStep(db_00,pStepList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishTrigger(
  Parse *pParse,          /* Parser context */
  TriggerStep *pStepList, /* The triggered program */
  Token *pAll             /* Token that describes the complete CREATE TRIGGER */
){
  Trigger *pTrig = pParse->pNewTrigger;   /* Trigger being finished */
  char *zName;                            /* Name of trigger */
  sqlite3 *db = pParse->db;               /* The database */
  DbFixer sFix;                           /* Fixer object */
  int iDb;                                /* Database containing the trigger */
  Token nameToken;                        /* Trigger name for error reporting */

  pParse->pNewTrigger = 0;
  if( NEVER(pParse->nErr) || !pTrig ) goto triggerfinish_cleanup;
  zName = pTrig->zName;
  iDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
  pTrig->step_list = pStepList;
  while( pStepList ){
    pStepList->pTrig = pTrig;
    pStepList = pStepList->pNext;
  }
  sqlite3TokenInit(&nameToken, pTrig->zName);
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", &nameToken);
  if( sqlite3FixTriggerStep(&sFix, pTrig->step_list)
   || sqlite3FixExpr(&sFix, pTrig->pWhen)
  ){
    goto triggerfinish_cleanup;
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( IN_RENAME_OBJECT ){
    assert( !db->init.busy );
    pParse->pNewTrigger = pTrig;
    pTrig = 0;
  }else
#endif

  /* if we are not initializing,
  ** build the sqlite_schema entry
  */
  if( !db->init.busy ){
    Vdbe *v;
    char *z;

    /* If this is a new CREATE TABLE statement, and if shadow tables
    ** are read-only, and the trigger makes a change to a shadow table,
    ** then raise an error - do not allow the trigger to be created. */
    if( sqlite3ReadOnlyShadowTables(db) ){
      TriggerStep *pStep;
      for(pStep=pTrig->step_list; pStep; pStep=pStep->pNext){
        if( pStep->zTarget!=0
         && sqlite3ShadowTableName(db, pStep->zTarget)
        ){
          sqlite3ErrorMsg(pParse,
            "trigger \"%s\" may not write to shadow table \"%s\"",
            pTrig->zName, pStep->zTarget);
          goto triggerfinish_cleanup;
        }
      }
    }

    /* Make an entry in the sqlite_schema table */
    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto triggerfinish_cleanup;
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    z = sqlite3DbStrNDup(db, (char*)pAll->z, pAll->n);
    testcase( z==0 );
    sqlite3NestedParse(pParse,
       "INSERT INTO %Q." LEGACY_SCHEMA_TABLE
       " VALUES('trigger',%Q,%Q,0,'CREATE TRIGGER %q')",
       db->aDb[iDb].zDbSName, zName,
       pTrig->table, z);
    sqlite3DbFree(db, z);
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddParseSchemaOp(v, iDb,
        sqlite3MPrintf(db, "type='trigger' AND name='%q'", zName), 0);
  }

  if( db->init.busy ){
    Trigger *pLink = pTrig;
    Hash *pHash = &db->aDb[iDb].pSchema->trigHash;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( pLink!=0 );
    pTrig = sqlite3HashInsert(pHash, zName, pTrig);
    if( pTrig ){
      sqlite3OomFault(db);
    }else if( pLink->pSchema==pLink->pTabSchema ){
      Table *pTab;
      pTab = sqlite3HashFind(&pLink->pTabSchema->tblHash, pLink->table);
      assert( pTab!=0 );
      pLink->pNext = pTab->pTrigger;
      pTab->pTrigger = pLink;
    }
  }

triggerfinish_cleanup:
  sqlite3DeleteTrigger(db, pTrig);
  assert( IN_RENAME_OBJECT || !pParse->pNewTrigger );
  sqlite3DeleteTriggerStep(db, pStepList);
}